

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O3

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  uint *puVar13;
  int iVar14;
  uint *puVar15;
  short sVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  char buffer [4];
  undefined4 local_34;
  
  if (hbSize < 4) {
    local_34 = 0;
    memcpy(&local_34,headerBuffer,hbSize);
    sVar5 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,&local_34,4);
    sVar7 = 0xfffffffffffffffc;
    if (sVar5 <= hbSize) {
      sVar7 = sVar5;
    }
    if (0xfffffffffffffff7 < sVar5) {
      sVar7 = sVar5;
    }
  }
  else {
    uVar17 = *headerBuffer;
    uVar18 = uVar17 & 0xf;
    sVar7 = 0xfffffffffffffffb;
    if (uVar18 < 0xb) {
      *tableLogPtr = uVar18 + 5;
      iVar20 = 0x20 << (sbyte)uVar18;
      uVar3 = *maxSVPtr;
      iVar21 = iVar20 + 1;
      iVar19 = uVar18 + 6;
      uVar17 = uVar17 >> 4;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar15 = (uint *)((long)headerBuffer + (hbSize - 4));
      uVar18 = 4;
      bVar22 = true;
      uVar11 = 0;
      puVar12 = (uint *)headerBuffer;
      do {
        if (!bVar22) {
          sVar16 = (short)uVar17;
          uVar6 = uVar11;
          while (sVar16 == -1) {
            if (puVar12 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar13 = (uint *)((long)puVar12 + 2);
              puVar12 = (uint *)((long)puVar12 + 2);
              uVar17 = *puVar13 >> ((byte)uVar18 & 0x1f);
            }
            else {
              uVar17 = uVar17 >> 0x10;
              uVar18 = uVar18 + 0x10;
            }
            uVar6 = (ulong)((int)uVar6 + 0x18);
            sVar16 = (short)uVar17;
          }
          while( true ) {
            uVar8 = uVar17 & 3;
            iVar4 = (int)uVar6;
            if (uVar8 != 3) break;
            uVar6 = (ulong)(iVar4 + 3);
            uVar17 = uVar17 >> 2;
            uVar18 = uVar18 + 2;
          }
          uVar9 = iVar4 + uVar8;
          if (uVar3 < uVar9) {
            return 0xfffffffffffffff9;
          }
          if ((uint)uVar11 < uVar9) {
            memset(normalizedCounter + uVar11,0,(ulong)(~(uint)uVar11 + iVar4 + uVar8) * 2 + 2);
            uVar11 = (ulong)uVar9;
          }
          uVar18 = uVar18 + 2;
          iVar4 = (int)uVar18 >> 3;
          puVar13 = (uint *)((long)puVar12 + (long)iVar4);
          if ((puVar2 < puVar12) && (puVar15 < puVar13)) {
            uVar17 = uVar17 >> 2;
          }
          else {
            uVar18 = uVar18 & 7;
            uVar17 = *(uint *)((long)puVar12 + (long)iVar4) >> (sbyte)uVar18;
            puVar12 = puVar13;
          }
        }
        uVar8 = iVar20 * 2 - 1;
        uVar9 = uVar8 - iVar21;
        uVar10 = iVar20 - 1U & uVar17;
        if (uVar10 < uVar9) {
          iVar4 = iVar19 + -1;
        }
        else {
          uVar17 = uVar17 & uVar8;
          if ((int)uVar17 < iVar20) {
            uVar9 = 0;
          }
          uVar10 = uVar17 - uVar9;
          iVar4 = iVar19;
        }
        iVar1 = uVar10 - 1;
        iVar14 = 1 - uVar10;
        if (0 < (int)uVar10) {
          iVar14 = iVar1;
        }
        iVar21 = iVar21 - iVar14;
        normalizedCounter[uVar11] = (short)iVar1;
        bVar22 = iVar1 != 0;
        for (; iVar21 < iVar20; iVar20 = iVar20 >> 1) {
          iVar19 = iVar19 + -1;
        }
        uVar17 = iVar4 + uVar18;
        puVar13 = (uint *)((long)((int)uVar17 >> 3) + (long)puVar12);
        uVar8 = (uint)uVar11;
        uVar9 = uVar8 + 1;
        uVar11 = (ulong)uVar9;
        uVar18 = uVar17 & 7;
        if (puVar2 < puVar12 && puVar15 < puVar13) {
          puVar13 = puVar15;
          uVar18 = uVar17 + ((int)puVar12 - (int)puVar15) * 8;
        }
        uVar17 = *puVar13 >> ((byte)uVar18 & 0x1f);
      } while ((1 < iVar21) && (puVar12 = puVar13, uVar9 <= uVar3));
      sVar7 = 0xfffffffffffffffc;
      if ((iVar21 == 1) && ((int)uVar18 < 0x21)) {
        while (uVar9 <= uVar3) {
          normalizedCounter[uVar11] = 0;
          uVar9 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar9;
        }
        *maxSVPtr = uVar8;
        sVar7 = (long)puVar13 + ((long)((int)(uVar18 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar7;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    DEBUGLOG(5, "FSE_readNCount");

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}